

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

Template * __thiscall
inja::Parser::parse(Template *__return_storage_ptr__,Parser *this,string_view input,path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  local_48 = &local_38;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,input._M_str,input._M_str + input._M_len);
  (__return_storage_ptr__->root).super_AstNode.pos = 0;
  (__return_storage_ptr__->root).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_00154078;
  (__return_storage_ptr__->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->root).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(__return_storage_ptr__->content).field_2;
  (__return_storage_ptr__->content)._M_dataplus._M_p = (pointer)paVar1;
  if (local_48 == &local_38) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_37,local_38);
    *(undefined8 *)((long)&(__return_storage_ptr__->content).field_2 + 8) = uStack_30;
  }
  else {
    (__return_storage_ptr__->content)._M_dataplus._M_p = local_48;
    (__return_storage_ptr__->content).field_2._M_allocated_capacity = CONCAT71(uStack_37,local_38);
  }
  (__return_storage_ptr__->content)._M_string_length = local_40;
  local_40 = 0;
  local_38 = '\0';
  p_Var2 = &(__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->block_storage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = &local_38;
  parse_into(this,__return_storage_ptr__,path);
  return __return_storage_ptr__;
}

Assistant:

Template parse(std::string_view input, std::filesystem::path path) {
    auto result = Template(std::string(input));
    parse_into(result, path);
    return result;
  }